

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_hashes(bt_peer_connection *this,int received)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  int32_t b;
  int32_t i_00;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  torrent_info *ptVar7;
  file_storage *pfVar8;
  index_type iVar9;
  char *pcVar10;
  difference_type dVar11;
  int *piVar12;
  span<const_char> sVar13;
  error_code local_1d0;
  span<libtorrent::digest32<256L>_> local_1c0;
  undefined1 local_1b0 [8];
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_190;
  const_iterator local_188;
  const_iterator local_180;
  hash_request *local_178;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_170;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_168;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  new_end;
  error_code local_158;
  int local_148 [3];
  undefined1 local_139;
  int proof_hashes;
  int local_124;
  undefined1 local_120 [8];
  hash_request hr;
  int proof_layers;
  int count;
  int index;
  int base;
  sha256_hash local_f4;
  int local_d4;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_d0;
  file_index_t i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_c4;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  undefined1 local_a8 [4];
  file_index_t file_index;
  sha256_hash file_root;
  char *ptr;
  undefined1 auStack_78 [4];
  int header_size;
  span<const_char> recv_buffer;
  file_storage *files;
  undefined1 local_40 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  error_code local_28;
  int local_14;
  bt_peer_connection *pbStack_10;
  int received_local;
  bt_peer_connection *this_local;
  
  local_14 = received;
  pbStack_10 = this;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar3) + 0x1f) & 1) == 0) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_28,invalid_message,(type *)0x0);
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _7_1_ = 2;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_28,1,2);
  }
  else {
    peer_connection::associated_torrent((peer_connection *)&files);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_40);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)&files);
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    ptVar7 = torrent::torrent_file(peVar6);
    pfVar8 = torrent_info::files(ptVar7);
    sVar13 = crypto_receive_buffer::get(&this->m_recv_buffer);
    recv_buffer.m_ptr = (char *)sVar13.m_len;
    _auStack_78 = sVar13.m_ptr;
    iVar9 = span<const_char>::size((span<const_char> *)auStack_78);
    if (0x30 < iVar9) {
      pcVar10 = span<const_char>::begin((span<const_char> *)auStack_78);
      file_root.m_number._M_elems._24_8_ = pcVar10 + 1;
      digest32<256L>::digest32
                ((digest32<256L> *)local_a8,(char *)file_root.m_number._M_elems._24_8_);
      __range2._4_4_ = -1;
      ___end2 = file_storage::file_range(pfVar8);
      local_c4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                 ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                          *)&__end2);
      rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
            ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                   *)&__end2);
      while( true ) {
        i.m_val = (int)local_c4.m_idx.m_val;
        local_d0 = rhs.m_idx.m_val;
        bVar2 = libtorrent::operator!=(local_c4,rhs);
        if (!bVar2) break;
        local_d4 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                        ::operator*(&local_c4);
        file_storage::root(&local_f4,pfVar8,(file_index_t)local_d4);
        bVar2 = digest32<256L>::operator==(&local_f4,(digest32<256L> *)local_a8);
        if (bVar2) {
          __range2._4_4_ = local_d4;
          break;
        }
        index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
        operator++(&local_c4);
      }
      dVar11 = digest32<256L>::size();
      file_root.m_number._M_elems._24_8_ = file_root.m_number._M_elems._24_8_ + dVar11;
      b = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
      i_00 = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
      hr.proof_layers = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
      hr.count = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
      local_124 = __range2._4_4_;
      hash_request::hash_request
                ((hash_request *)local_120,__range2._4_4_,b,i_00,hr.proof_layers,hr.count);
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      ptVar7 = torrent::torrent_file(peVar6);
      pfVar8 = torrent_info::files(ptVar7);
      bVar2 = validate_hash_request((hash_request *)local_120,pfVar8);
      iVar3 = hr.count;
      if (bVar2) {
        local_148[1] = 0;
        iVar4 = merkle_num_leafs(hr.proof_layers);
        iVar4 = merkle_num_layers(iVar4);
        local_148[0] = (iVar3 - iVar4) + 1;
        piVar12 = ::std::max<int>(local_148 + 1,local_148);
        local_148[2] = *piVar12;
        iVar3 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
        iVar4 = hr.proof_layers + local_148[2];
        dVar11 = digest32<256L>::size();
        if (iVar3 == iVar4 * (int)dVar11 + 0x31) {
          bVar2 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
          if (bVar2) {
            local_170._M_current =
                 (hash_request *)
                 ::std::
                 vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                 ::begin(&this->m_hash_requests);
            local_178 = (hash_request *)
                        ::std::
                        vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                        ::end(&this->m_hash_requests);
            local_168 = ::std::
                        remove<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,libtorrent::aux::hash_request>
                                  (local_170,
                                   (__normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
                                    )local_178,(hash_request *)local_120);
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
            ::__normal_iterator<libtorrent::aux::hash_request*>
                      ((__normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
                        *)&local_180,&local_168);
            local_190._M_current =
                 (hash_request *)
                 ::std::
                 vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                 ::end(&this->m_hash_requests);
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
            ::__normal_iterator<libtorrent::aux::hash_request*>
                      ((__normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
                        *)&local_188,&local_190);
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)::std::
                          vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                          ::erase(&this->m_hash_requests,local_180,local_188);
            ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::vector((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      *)local_1b0);
            for (; uVar1 = file_root.m_number._M_elems._24_8_,
                pcVar10 = span<const_char>::end((span<const_char> *)auStack_78),
                (char *)uVar1 != pcVar10;
                file_root.m_number._M_elems._24_8_ = dVar11 + file_root.m_number._M_elems._24_8_) {
              ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
              emplace_back<char_const*&>
                        ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                          *)local_1b0,(char **)(file_root.m_number._M_elems + 6));
              dVar11 = digest32<256L>::size();
            }
            bVar2 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
            if (bVar2) {
              uVar5 = strong_typedef::operator_cast_to_int((strong_typedef *)local_120);
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"HASHES",
                         "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar5,
                         (ulong)(uint)local_120._4_4_,hr.file.m_val,hr.base,hr.index);
            }
            peVar6 = ::std::
                     __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            span<libtorrent::digest32<256l>>::
            span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                      ((span<libtorrent::digest32<256l>> *)&local_1c0,
                       (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        *)local_1b0);
            bVar2 = torrent::add_hashes(peVar6,(hash_request *)local_120,local_1c0);
            if (bVar2) {
              maybe_send_hash_request(this);
            }
            else {
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (&local_1d0,invalid_hashes,(type *)0x0);
              (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                        (this,&local_1d0,1,2);
            }
            ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::~vector((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       *)local_1b0);
          }
        }
        else {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_158,invalid_hashes,(type *)0x0);
          new_end._M_current._7_1_ = 2;
          (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                    (this,&local_158,1,2);
        }
      }
      else {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&proof_hashes,invalid_hashes,(type *)0x0);
        local_139 = 2;
        (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                  (this,(error_code *)&proof_hashes,1,2);
      }
    }
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_40);
  }
  return;
}

Assistant:

void bt_peer_connection::on_hashes(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();

		int const header_size = 1 + 32 + 4 + 4 + 4 + 4;

		if (recv_buffer.size() < header_size)
		{
			return;
		}

		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t file_index{ -1 };
		for (file_index_t i : files.file_range())
		{
			if (files.root(i) == file_root)
			{
				file_index = i;
				break;
			}
		}
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);

		hash_request const hr(file_index, base, index, count, proof_layers);

		if (!validate_hash_request(hr, t->torrent_file().files()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		// subtract one because the the base layer doesn't count
		int const proof_hashes = std::max(0
			, proof_layers - (merkle_num_layers(merkle_num_leafs(count)) - 1));

		if (m_recv_buffer.packet_size() != header_size
			+ (count + proof_hashes) * int(sha256_hash::size()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		m_hash_requests.erase(new_end, m_hash_requests.end());

		std::vector<sha256_hash> hashes;
		while (ptr != recv_buffer.end())
		{
			hashes.emplace_back(ptr);
			ptr += sha256_hash::size();
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!t->add_hashes(hr, hashes))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		maybe_send_hash_request();
	}